

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffc2jj(char *cval,LONGLONG *ival,int *status)

{
  int *piVar1;
  longlong lVar2;
  char local_88 [8];
  char msg [81];
  char *loc;
  int *status_local;
  LONGLONG *ival_local;
  char *cval_local;
  
  if (*status < 1) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    *ival = 0;
    lVar2 = strtoll(cval,(char **)(msg + 0x50),10);
    *ival = lVar2;
    if ((*stack0xffffffffffffffd0 != '\0') && (*stack0xffffffffffffffd0 != ' ')) {
      *status = 0x197;
    }
    piVar1 = __errno_location();
    if (*piVar1 == 0x22) {
      strcpy(local_88,"Range Error in ffc2jj converting string to longlong int: ");
      strncat(local_88,cval,0x17);
      ffpmsg(local_88);
      *status = 0x19c;
      piVar1 = __errno_location();
      *piVar1 = 0;
    }
    cval_local._4_4_ = *status;
  }
  else {
    cval_local._4_4_ = *status;
  }
  return cval_local._4_4_;
}

Assistant:

int ffc2jj(const char *cval,  /* I - string representation of the value */
          LONGLONG *ival,     /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert null-terminated formatted string to an long long integer value
*/
{
    char *loc, msg[81];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    errno = 0;
    *ival = 0;

#if defined(_MSC_VER)

    /* Microsoft Visual C++ 6.0 does not have the strtoll function */
    *ival =  _atoi64(cval);
    loc = (char *) cval;
    while (*loc == ' ') loc++;     /* skip spaces */
    if    (*loc == '-') loc++;     /* skip minus sign */
    if    (*loc == '+') loc++;     /* skip plus sign */
    while (isdigit(*loc)) loc++;   /* skip digits */

#elif (USE_LL_SUFFIX == 1)
    *ival = strtoll(cval, &loc, 10);  /* read the string as an integer */
#else
    *ival = strtol(cval, &loc, 10);  /* read the string as an integer */
#endif

    /* check for read error, or junk following the integer */
    if (*loc != '\0' && *loc != ' ' ) 
        *status = BAD_C2I;

    if (errno == ERANGE)
    {
        strcpy(msg,"Range Error in ffc2jj converting string to longlong int: ");
        strncat(msg,cval,23);
        ffpmsg(msg);

        *status = NUM_OVERFLOW;
        errno = 0;
    }

    return(*status);
}